

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int iVar1;
  uint _w;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  int j;
  long lVar7;
  int i;
  ulong uVar8;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar3 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar1 = inch + 7;
  if (-1 < inch) {
    iVar1 = inch;
  }
  if (outch < 4) {
    Mat::create(kernel_tm,_w * 8,iVar1 >> 3,outch,1,(Allocator *)0x0);
  }
  else {
    Mat::create(kernel_tm,_w * 0x20,iVar1 >> 3,outch + ((uint)outch >> 2) * -3,1,(Allocator *)0x0);
    uVar6 = uVar3;
    do {
      if (7 < inch) {
        pvVar5 = (void *)((uVar6 >> 2) * kernel_tm->cstep * kernel_tm->elemsize +
                         (long)kernel_tm->data);
        lVar2 = 0;
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              uVar8 = 0;
              do {
                pvVar4 = pvVar5;
                lVar7 = 0;
                do {
                  *(undefined1 *)((long)pvVar4 + lVar7) =
                       *(undefined1 *)
                        ((long)local_78.data +
                        uVar3 + (lVar2 + lVar7) * (long)local_78.w * local_78.elemsize +
                                local_78.cstep * (uVar8 | uVar6) * local_78.elemsize);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 8);
                uVar8 = uVar8 + 1;
                pvVar5 = (void *)((long)pvVar4 + 8);
              } while (uVar8 != 4);
              uVar3 = uVar3 + 1;
              pvVar5 = (void *)((long)pvVar4 + 8);
            } while (uVar3 != _w);
            pvVar5 = (void *)((long)pvVar4 + 8);
          }
          lVar7 = lVar2 + 0xf;
          lVar2 = lVar2 + 8;
        } while (lVar7 < inch);
      }
      uVar3 = uVar6 + 4;
      uVar8 = uVar6 + 7;
      uVar6 = uVar3;
    } while (uVar8 < (uint)outch);
  }
  if ((int)uVar3 < outch) {
    uVar3 = uVar3 & 0xffffffff;
    do {
      if (7 < inch) {
        pvVar5 = (void *)((ulong)(((uint)uVar3 & 3) + ((uint)(uVar3 >> 2) & 0x3fffffff)) *
                          kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
        lVar2 = 0;
        do {
          if (0 < (int)_w) {
            uVar6 = 0;
            do {
              pvVar4 = pvVar5;
              lVar7 = 0;
              do {
                *(undefined1 *)((long)pvVar4 + lVar7) =
                     *(undefined1 *)
                      ((long)local_78.data +
                      uVar6 + (lVar2 + lVar7) * (long)local_78.w * local_78.elemsize +
                              local_78.cstep * uVar3 * local_78.elemsize);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 8);
              uVar6 = uVar6 + 1;
              pvVar5 = (void *)((long)pvVar4 + 8);
            } while (uVar6 != _w);
            pvVar5 = (void *)((long)pvVar4 + 8);
          }
          lVar7 = lVar2 + 0xf;
          lVar2 = lVar2 + 8;
        } while (lVar7 < inch);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8a-4b-maxk-inch/8a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (outch >= 4)
        kernel_tm.create(32 * maxk, inch / 8, outch / 4 + outch % 4, (size_t)1u);
    else
        kernel_tm.create(8 * maxk, inch / 8, outch, (size_t)1u);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    // TODO unroll 2
    for (; q < outch; q++)
    {
        signed char* g00 = kernel_tm.channel(q / 4 + q % 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 8; j++)
                {
                    const signed char* k00 = kernel.channel(q).row<const signed char>(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}